

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::invalid_option_format_error::invalid_option_format_error
          (invalid_option_format_error *this,string *format)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *format_local;
  invalid_option_format_error *this_local;
  
  local_18 = format;
  format_local = (string *)this;
  std::operator+(&local_58,anon_var_dwarf_35912,format);
  std::operator+(&local_38,&local_58,anon_var_dwarf_3591e);
  OptionSpecException::OptionSpecException(&this->super_OptionSpecException,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  *(undefined ***)&(this->super_OptionSpecException).super_OptionException =
       &PTR__invalid_option_format_error_001e4510;
  return;
}

Assistant:

invalid_option_format_error(const std::string& format)
    : OptionSpecException(u8"Invalid option format ‘" + format + u8"’")
    {
    }